

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O3

ngx_int_t ngx_copy_file(u_char *from,u_char *to,ngx_copy_file_t *cf)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *__buf;
  size_t sVar4;
  ngx_int_t nVar5;
  int *piVar6;
  char *pcVar7;
  int err;
  size_t size;
  ngx_log_t *pnVar8;
  u_char *puVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 local_d8 [8];
  ngx_file_info_t fi;
  
  iVar2 = open64((char *)from,0,0);
  if (iVar2 == -1) {
    pnVar8 = cf->log;
    if (pnVar8->log_level < 3) {
      return -1;
    }
    piVar6 = __errno_location();
    ngx_log_error_core(3,pnVar8,*piVar6,"open() \"%s\" failed",from);
    return -1;
  }
  sVar10 = cf->size;
  fi.__glibc_reserved[2] = (__syscall_slong_t)from;
  if ((cf->size == 0xffffffffffffffff) &&
     (iVar3 = fstat64(iVar2,(stat64 *)local_d8), sVar10 = fi.st_rdev, iVar3 == -1)) {
    pnVar8 = cf->log;
    nVar5 = -1;
    if (pnVar8->log_level < 2) {
      __buf = (void *)0x0;
      goto LAB_0011b4f8;
    }
    piVar6 = __errno_location();
    iVar3 = *piVar6;
    pcVar7 = "fstat() \"%s\" failed";
    __buf = (void *)0x0;
    to = (u_char *)fi.__glibc_reserved[2];
LAB_0011b4f1:
    ngx_log_error_core(2,pnVar8,iVar3,pcVar7,to);
  }
  else {
    size = 0x10000;
    if (cf->buf_size != 0) {
      size = cf->buf_size;
    }
    if ((long)sVar10 <= (long)size) {
      size = sVar10;
    }
    __buf = ngx_alloc(size,cf->log);
    if (__buf == (void *)0x0) {
      __buf = (void *)0x0;
    }
    else {
      iVar3 = open64((char *)to,0x41,cf->access);
      if (iVar3 != -1) {
        puVar9 = to;
        if (0 < (long)sVar10) {
          do {
            if ((long)sVar10 <= (long)size) {
              size = sVar10;
            }
            sVar4 = read(iVar2,__buf,size);
            if (sVar4 == 0xffffffffffffffff) {
              pnVar8 = cf->log;
              nVar5 = -1;
              if (pnVar8->log_level < 2) goto LAB_0011b4c0;
              piVar6 = __errno_location();
              err = *piVar6;
              pcVar7 = "read() \"%s\" failed";
              puVar9 = (u_char *)fi.__glibc_reserved[2];
              goto LAB_0011b483;
            }
            if (sVar4 != size) {
              pnVar8 = cf->log;
              if (1 < pnVar8->log_level) {
                pcVar7 = "read() has read only %z of %O from %s";
                puVar9 = (u_char *)fi.__glibc_reserved[2];
LAB_0011b4a5:
                ngx_log_error_core(2,pnVar8,0,pcVar7,sVar4,sVar10,puVar9);
              }
LAB_0011b4b9:
              nVar5 = -1;
              goto LAB_0011b4c0;
            }
            sVar4 = write(iVar3,__buf,size);
            if (sVar4 == 0xffffffffffffffff) {
              pnVar8 = cf->log;
              nVar5 = -1;
              if (pnVar8->log_level < 2) goto LAB_0011b4c0;
              piVar6 = __errno_location();
              err = *piVar6;
              pcVar7 = "write() \"%s\" failed";
              goto LAB_0011b483;
            }
            if (sVar4 != size) {
              pnVar8 = cf->log;
              if (1 < pnVar8->log_level) {
                pcVar7 = "write() has written only %z of %O to %s";
                goto LAB_0011b4a5;
              }
              goto LAB_0011b4b9;
            }
            sVar11 = sVar10 - size;
            bVar1 = (long)size <= (long)sVar10;
            sVar10 = sVar11;
          } while (sVar11 != 0 && bVar1);
        }
        if ((cf->time == -1) || (nVar5 = ngx_set_file_time(to,iVar3,cf->time), nVar5 == 0)) {
          nVar5 = 0;
        }
        else {
          pnVar8 = cf->log;
          nVar5 = -1;
          if (1 < pnVar8->log_level) {
            piVar6 = __errno_location();
            err = *piVar6;
            pcVar7 = "utimes() \"%s\" failed";
LAB_0011b483:
            nVar5 = -1;
            ngx_log_error_core(2,pnVar8,err,pcVar7,puVar9);
          }
        }
LAB_0011b4c0:
        iVar3 = close(iVar3);
        if ((iVar3 != -1) || (pnVar8 = cf->log, pnVar8->log_level < 2)) goto LAB_0011b4f8;
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        pcVar7 = "close() \"%s\" failed";
        goto LAB_0011b4f1;
      }
      pnVar8 = cf->log;
      if (2 < pnVar8->log_level) {
        piVar6 = __errno_location();
        ngx_log_error_core(3,pnVar8,*piVar6,"open() \"%s\" failed",to);
      }
    }
    nVar5 = -1;
  }
LAB_0011b4f8:
  iVar2 = close(iVar2);
  if ((iVar2 == -1) && (pnVar8 = cf->log, 1 < pnVar8->log_level)) {
    piVar6 = __errno_location();
    ngx_log_error_core(2,pnVar8,*piVar6,"close() \"%s\" failed",fi.__glibc_reserved[2]);
  }
  if (__buf != (void *)0x0) {
    free(__buf);
  }
  return nVar5;
}

Assistant:

ngx_int_t
ngx_copy_file(u_char *from, u_char *to, ngx_copy_file_t *cf)
{
    char             *buf;
    off_t             size;
    size_t            len;
    ssize_t           n;
    ngx_fd_t          fd, nfd;
    ngx_int_t         rc;
    ngx_file_info_t   fi;

    rc = NGX_ERROR;
    buf = NULL;
    nfd = NGX_INVALID_FILE;

    fd = ngx_open_file(from, NGX_FILE_RDONLY, NGX_FILE_OPEN, 0);

    if (fd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, cf->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", from);
        goto failed;
    }

    if (cf->size != -1) {
        size = cf->size;

    } else {
        if (ngx_fd_info(fd, &fi) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_fd_info_n " \"%s\" failed", from);

            goto failed;
        }

        size = ngx_file_size(&fi);
    }

    len = cf->buf_size ? cf->buf_size : 65536;

    if ((off_t) len > size) {
        len = (size_t) size;
    }

    buf = ngx_alloc(len, cf->log);
    if (buf == NULL) {
        goto failed;
    }

    nfd = ngx_open_file(to, NGX_FILE_WRONLY, NGX_FILE_CREATE_OR_OPEN,
                        cf->access);

    if (nfd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, cf->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", to);
        goto failed;
    }

    while (size > 0) {

        if ((off_t) len > size) {
            len = (size_t) size;
        }

        n = ngx_read_fd(fd, buf, len);

        if (n == -1) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_read_fd_n " \"%s\" failed", from);
            goto failed;
        }

        if ((size_t) n != len) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, 0,
                          ngx_read_fd_n " has read only %z of %O from %s",
                          n, size, from);
            goto failed;
        }

        n = ngx_write_fd(nfd, buf, len);

        if (n == -1) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_write_fd_n " \"%s\" failed", to);
            goto failed;
        }

        if ((size_t) n != len) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, 0,
                          ngx_write_fd_n " has written only %z of %O to %s",
                          n, size, to);
            goto failed;
        }

        size -= n;
    }

    if (cf->time != -1) {
        if (ngx_set_file_time(to, nfd, cf->time) != NGX_OK) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_set_file_time_n " \"%s\" failed", to);
            goto failed;
        }
    }

    rc = NGX_OK;

failed:

    if (nfd != NGX_INVALID_FILE) {
        if (ngx_close_file(nfd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_close_file_n " \"%s\" failed", to);
        }
    }

    if (fd != NGX_INVALID_FILE) {
        if (ngx_close_file(fd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_close_file_n " \"%s\" failed", from);
        }
    }

    if (buf) {
        ngx_free(buf);
    }

    return rc;
}